

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

ps_seg_t * allphone_search_seg_next(ps_seg_t *seg)

{
  ps_segfuncs_t *ppVar1;
  _func_ps_seg_t_ptr_ps_seg_t_ptr *p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  
  ppVar1 = (ps_segfuncs_t *)(seg[1].vt)->seg_free;
  seg[1].vt = ppVar1;
  if (ppVar1 == (ps_segfuncs_t *)0x0) {
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    p_Var2 = ppVar1->seg_next;
    uVar3 = *(undefined8 *)(p_Var2 + 4);
    seg->sf = (int)uVar3;
    seg->ef = (int)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)(p_Var2 + 0xc);
    seg->ascr = (int)uVar3;
    seg->lscr = (int)((ulong)uVar3 >> 0x20);
    pcVar4 = bin_mdef_ciphone_str(seg->search->acmod->mdef,(int)*(short *)p_Var2);
    seg->text = pcVar4;
    seg->wid = -1;
  }
  return seg;
}

Assistant:

static ps_seg_t *
allphone_search_seg_next(ps_seg_t * seg)
{
    phseg_iter_t *itor = (phseg_iter_t *) seg;
    phseg_t *phseg;

    itor->seg = itor->seg->next;
    
    if (itor->seg == NULL) {
	allphone_search_seg_free(seg);
        return NULL;
    }
    phseg = gnode_ptr(itor->seg);
    allphone_search_fill_iter(seg, phseg);

    return seg;
}